

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall
wabt::interp::ElemSegment::ElemSegment(ElemSegment *this,Store *store,ElemDesc *desc,Ptr *inst)

{
  pointer pFVar1;
  Result RVar2;
  Ref RVar3;
  Instance *this_00;
  pointer pFVar4;
  Value value;
  Ptr out_trap;
  Ptr local_c0;
  
  this->desc_ = desc;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out_trap.obj_ = (Trap *)0x0;
  out_trap.store_ = (Store *)0x0;
  out_trap.root_index_ = 0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::reserve
            (&this->elements_,
             ((long)(desc->elements).
                    super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(desc->elements).
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x78);
  pFVar4 = (desc->elements).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (desc->elements).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pFVar4 == pFVar1) {
      RefPtr<wabt::interp::Trap>::reset(&out_trap);
      return;
    }
    value.field_0.i64_ = 0;
    value.field_0._8_8_ = 0;
    RVar3 = RefPtr<wabt::interp::Instance>::ref(inst);
    FuncDesc::FuncDesc((FuncDesc *)&stack0xffffffffffffff58,pFVar4);
    DefinedFunc::New(&local_c0,store,RVar3,(FuncDesc *)&stack0xffffffffffffff58);
    RVar3 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_c0);
    RefPtr<wabt::interp::DefinedFunc>::reset(&local_c0);
    this_00 = (Instance *)&stack0xffffffffffffff58;
    FuncDesc::~FuncDesc((FuncDesc *)&stack0xffffffffffffff58);
    RVar2 = Instance::CallInitFunc(this_00,store,RVar3,&value,&out_trap);
    if (RVar2.enum_ == Error) break;
    local_c0.obj_ = (DefinedFunc *)value.field_0.i64_;
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
    emplace_back<wabt::interp::Ref>(&this->elements_,(Ref *)&local_c0);
    pFVar4 = pFVar4 + 1;
  }
  abort();
}

Assistant:

ElemSegment::ElemSegment(Store& store,
                         const ElemDesc* desc,
                         Instance::Ptr& inst)
    : desc_(desc) {
  Trap::Ptr out_trap;
  elements_.reserve(desc->elements.size());
  for (auto&& elem_expr : desc->elements) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), elem_expr).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, &out_trap))) {
      WABT_UNREACHABLE;  // valid const expression cannot trap
    }
    elements_.push_back(value.Get<Ref>());
  }
}